

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O1

int Cmd_CommandAbcLoadPlugIn(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  bool bVar3;
  bool bVar4;
  FILE *pFVar5;
  FILE *pFVar6;
  int iVar7;
  Vec_Str_t *p;
  char *pcVar8;
  FILE *pFVar9;
  void **ppvVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  char *pTempFile;
  char pBuffer [1000];
  char *local_440;
  Vec_Str_t *local_438;
  char *local_430;
  FILE *local_428;
  undefined8 local_420;
  char local_418 [1000];
  
  local_440 = (char *)0x0;
  bVar4 = false;
  Extra_UtilGetoptReset();
  bVar3 = false;
  while( true ) {
    while (iVar7 = Extra_UtilGetopt(argc,argv,"vph"), iVar7 == 0x70) {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    if (iVar7 == -1) break;
    if (iVar7 != 0x76) goto LAB_002beb1d;
    bVar4 = (bool)(bVar4 ^ 1);
  }
  if (globalUtilOptind + 2 == argc) {
    pcVar11 = argv[(long)argc + -2];
    local_420 = argv[(long)argc + -1];
    if (bVar3) {
LAB_002bea86:
      pcVar12 = ".txt";
      iVar7 = Util_SignalTmpFile("__abctmp_",".txt",&local_440);
      if (iVar7 != -1) {
        close(iVar7);
        p = (Vec_Str_t *)malloc(0x10);
        p->nCap = 1000;
        p->nSize = 0;
        pcVar8 = (char *)malloc(1000);
        p->pArray = pcVar8;
        local_430 = pcVar11;
        Vec_StrPrintF(p,pcVar12,pcVar11,local_440);
        uVar1 = p->nCap;
        if (p->nSize == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (p->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc(0x10);
            }
            else {
              pcVar11 = (char *)realloc(p->pArray,0x10);
            }
            sVar13 = 0x10;
          }
          else {
            sVar13 = (ulong)uVar1 * 2;
            if ((int)sVar13 <= (int)uVar1) goto LAB_002bec6d;
            if (p->pArray == (char *)0x0) {
              pcVar11 = (char *)malloc(sVar13);
            }
            else {
              pcVar11 = (char *)realloc(p->pArray,sVar13);
            }
          }
          p->pArray = pcVar11;
          p->nCap = (int)sVar13;
        }
LAB_002bec6d:
        iVar7 = p->nSize;
        p->nSize = iVar7 + 1;
        p->pArray[iVar7] = '\0';
        if (bVar4) {
          Abc_Print(2,"Running command %s\n",p->pArray);
        }
        iVar7 = Util_SignalSystem(p->pArray);
        if (iVar7 != 0) {
          pFVar9 = (FILE *)0x0;
          Abc_Print(-1,"Command \"%s\" failed.\n",p->pArray);
          goto LAB_002beec4;
        }
        local_438 = p;
        pFVar9 = fopen(local_440,"r");
        if (pFVar9 != (FILE *)0x0) {
          pcVar11 = fgets(local_418,1000,pFVar9);
          pFVar6 = pFVar9;
          pFVar5 = local_428;
          goto joined_r0x002bed04;
        }
        pFVar9 = (FILE *)0x0;
        iVar7 = -1;
        Abc_Print(-1,"Cannot open file with the list of commands.\n");
        p = local_438;
        goto LAB_002beec4;
      }
      Abc_Print(-1,"Cannot create a temporary file.\n");
    }
    else {
      pFVar9 = fopen(pcVar11,"r");
      if (pFVar9 == (FILE *)0x0) {
        Abc_Print(-1,"Cannot run the binary \"%s\". File does not exist.\n",pcVar11);
        iVar7 = 6;
      }
      else {
        fclose(pFVar9);
        iVar7 = 0;
      }
      if (iVar7 != 6) {
        if (iVar7 != 0) {
          return argc;
        }
        goto LAB_002bea86;
      }
    }
    iVar7 = -1;
    pFVar9 = (FILE *)0x0;
    p = (Vec_Str_t *)0x0;
    goto LAB_002beec4;
  }
LAB_002beb1d:
  Abc_Print(-2,"usage: load_plugin [-pvh] <plugin_dir\\binary_name> <section_name>\n");
  Abc_Print(-2,"\t        loads external binary as a plugin\n");
  pcVar12 = "yes";
  pcVar11 = "yes";
  if (!bVar3) {
    pcVar11 = "no";
  }
  Abc_Print(-2,"\t-p    : toggle searching the command in PATH [default = %s].\n",pcVar11);
  if (!bVar4) {
    pcVar12 = "no";
  }
  Abc_Print(-2,"\t-v    : enable verbose output [default = %s].\n",pcVar12);
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
joined_r0x002bed04:
  local_428 = pFVar6;
  if (pcVar11 == (char *)0x0) {
    iVar7 = 0;
    p = local_438;
    local_428 = pFVar5;
LAB_002beec4:
    if (pFVar9 != (FILE *)0x0) {
      fclose(pFVar9);
    }
    if (local_440 != (char *)0x0) {
      Util_SignalTmpFileRemove(local_440,0);
    }
    if (p != (Vec_Str_t *)0x0) {
      if (p->pArray != (char *)0x0) {
        free(p->pArray);
        p->pArray = (char *)0x0;
      }
      free(p);
    }
    if (local_440 == (char *)0x0) {
      return iVar7;
    }
    free(local_440);
    return iVar7;
  }
  sVar13 = strlen(local_418);
  if (local_418[sVar13 - 1] == '\n') {
    local_418[sVar13 - 1] = '\0';
  }
  Cmd_CommandAdd(pAbc,local_420,local_418,Cmd_CommandAbcPlugIn,1);
  pVVar2 = pAbc->vPlugInComBinPairs;
  pcVar11 = Extra_UtilStrsav(local_418);
  uVar1 = pVVar2->nCap;
  if (pVVar2->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc(0x80);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar10;
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar1 * 2;
      if (iVar7 <= (int)uVar1) goto LAB_002bedbd;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
      }
      pVVar2->pArray = ppvVar10;
    }
    pVVar2->nCap = iVar7;
  }
LAB_002bedbd:
  iVar7 = pVVar2->nSize;
  pVVar2->nSize = iVar7 + 1;
  pVVar2->pArray[iVar7] = pcVar11;
  pVVar2 = pAbc->vPlugInComBinPairs;
  pcVar11 = Extra_UtilStrsav(local_430);
  uVar1 = pVVar2->nCap;
  if (pVVar2->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc(0x80);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar10;
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar1 * 2;
      if (iVar7 <= (int)uVar1) goto LAB_002bee4f;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
      }
      pVVar2->pArray = ppvVar10;
    }
    pVVar2->nCap = iVar7;
  }
LAB_002bee4f:
  iVar7 = pVVar2->nSize;
  pVVar2->nSize = iVar7 + 1;
  pVVar2->pArray[iVar7] = pcVar11;
  if (bVar4) {
    Abc_Print(2,"Creating command %s with binary %s\n",local_418,local_430);
  }
  pFVar9 = local_428;
  pcVar11 = fgets(local_418,1000,local_428);
  pFVar6 = local_428;
  pFVar5 = local_428;
  goto joined_r0x002bed04;
}

Assistant:

int Cmd_CommandAbcLoadPlugIn( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int fPath, fVerbose;
    int fd = -1, RetValue = -1, c;
    FILE * pFile = NULL;
    char * pStrDirBin = NULL, * pStrSection = NULL;
    Vec_Str_t * sCommandLine = NULL;
    char * pTempFile = NULL;
    char pBuffer[1000];

    // set defaults
    fPath = 0;
    fVerbose = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vph" ) ) != EOF )
    {
        switch ( c )
        {
        case 'p':
            fPath ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
        goto usage;
    }
    }

    if ( argc != globalUtilOptind + 2 )
        goto usage;

    pStrDirBin  = argv[argc-2];
    pStrSection = argv[argc-1];

    // check if the file exists
    if ( !fPath )
    {
        FILE* pFile = fopen( pStrDirBin, "r" );

        if ( !pFile )
        {
            Abc_Print( ABC_ERROR, "Cannot run the binary \"%s\". File does not exist.\n", pStrDirBin );
            goto cleanup;
    }

    fclose( pFile );
    }

    // create temp file
    fd = Util_SignalTmpFile( "__abctmp_", ".txt", &pTempFile );

    if ( fd == -1 )
    {
        Abc_Print( ABC_ERROR, "Cannot create a temporary file.\n" );
        goto cleanup;
    }

#ifdef WIN32
    _close( fd );
#else
    close( fd );
#endif

    // get command list
    sCommandLine = Vec_StrAlloc(1000);

    Vec_StrPrintF(sCommandLine, "%s -abc -list-commands > %s", pStrDirBin, pTempFile );
    Vec_StrPush(sCommandLine, '\0');

    if(fVerbose)
    {
        Abc_Print(ABC_VERBOSE, "Running command %s\n", Vec_StrArray(sCommandLine));
    }

    RetValue = Util_SignalSystem( Vec_StrArray(sCommandLine) );

    if ( RetValue != 0 )
    {
        Abc_Print( ABC_ERROR, "Command \"%s\" failed.\n", Vec_StrArray(sCommandLine) );
        goto cleanup;
    }

    // create commands
    pFile = fopen( pTempFile, "r" );

    if ( pFile == NULL )
    {
        Abc_Print( -1, "Cannot open file with the list of commands.\n" );

        RetValue = -1;
        goto cleanup;
    }

    while ( fgets( pBuffer, 1000, pFile ) != NULL )
    {
        if ( pBuffer[strlen(pBuffer)-1] == '\n' )
            pBuffer[strlen(pBuffer)-1] = 0;

        Cmd_CommandAdd( pAbc, pStrSection, pBuffer, Cmd_CommandAbcPlugIn, 1 );

        Vec_PtrPush( pAbc->vPlugInComBinPairs, Extra_UtilStrsav(pBuffer) );
        Vec_PtrPush( pAbc->vPlugInComBinPairs, Extra_UtilStrsav(pStrDirBin) );

        if ( fVerbose )
        {
            Abc_Print(ABC_VERBOSE, "Creating command %s with binary %s\n", pBuffer, pStrDirBin);
    }
    }

cleanup:

    if( pFile )
    fclose( pFile );

    if( pTempFile )
    Util_SignalTmpFileRemove( pTempFile, 0 );

    Vec_StrFreeP(&sCommandLine);

    ABC_FREE( pTempFile );

    return RetValue;

usage:

    Abc_Print( -2, "usage: load_plugin [-pvh] <plugin_dir\\binary_name> <section_name>\n" );
    Abc_Print( -2, "\t        loads external binary as a plugin\n" );
    Abc_Print( -2, "\t-p    : toggle searching the command in PATH [default = %s].\n", fPath? "yes": "no" );
    Abc_Print( -2, "\t-v    : enable verbose output [default = %s].\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");

    return 1;
}